

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

void __thiscall
Minisat::
OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
::clean(OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
        *this,Lit *idx)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *__function;
  int iVar5;
  vec<Minisat::Solver::Watcher,_int> *pvVar6;
  long lVar7;
  long lVar8;
  
  iVar5 = idx->x;
  if (iVar5 < (this->occs).map.sz) {
    pvVar6 = (this->occs).map.data;
    iVar1 = pvVar6[iVar5].sz;
    if (iVar1 < 1) {
      if (iVar1 < 0) goto LAB_0010f5e0;
    }
    else {
      pvVar6 = pvVar6 + iVar5;
      lVar8 = 0;
      lVar7 = 0;
      iVar5 = 0;
      do {
        bVar2 = Solver::WatcherDeleted::operator()
                          (&this->deleted,(Watcher *)((long)&pvVar6->data->cref + lVar8));
        if (!bVar2) {
          lVar4 = (long)iVar5;
          iVar5 = iVar5 + 1;
          pvVar6->data[lVar4] = *(Watcher *)((long)&pvVar6->data->cref + lVar8);
        }
        lVar7 = lVar7 + 1;
        iVar1 = pvVar6->sz;
        lVar8 = lVar8 + 8;
      } while (lVar7 < iVar1);
      iVar3 = (int)lVar7 - iVar5;
      if (iVar1 < iVar3) {
LAB_0010f5e0:
        __assert_fail("nelems <= sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Vec.h"
                      ,0x41,
                      "void Minisat::vec<Minisat::Solver::Watcher>::shrink(Size) [T = Minisat::Solver::Watcher, _Size = int]"
                     );
      }
      if (0 < iVar3) {
        pvVar6->sz = (iVar5 + iVar1) - (int)lVar7;
      }
    }
    if (idx->x < (this->dirty).map.sz) {
      (this->dirty).map.data[idx->x] = '\0';
      return;
    }
    __function = 
    "V &Minisat::IntMap<Minisat::Lit, char, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = char, MkIndex = Minisat::MkIndexLit]"
    ;
  }
  else {
    __function = 
    "V &Minisat::IntMap<Minisat::Lit, Minisat::vec<Minisat::Solver::Watcher>, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = Minisat::vec<Minisat::Solver::Watcher>, MkIndex = Minisat::MkIndexLit]"
    ;
  }
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,__function);
}

Assistant:

void OccLists<K,Vec,Deleted,MkIndex>::clean(const K& idx)
{
    Vec& vec = occs[idx];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[idx] = 0;
}